

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int vdbeUnbind(Vdbe *p,int i)

{
  Mem *pMVar1;
  int iVar2;
  Mem *pVar;
  int i_local;
  Vdbe *p_local;
  
  iVar2 = vdbeSafetyNotNull(p);
  if (iVar2 == 0) {
    sqlite3_mutex_enter(p->db->mutex);
    if ((p->magic == 0xbdf20da3) && (p->pc < 0)) {
      if ((i < 1) || (p->nVar < i)) {
        sqlite3Error(p->db,0x19,(char *)0x0);
        sqlite3_mutex_leave(p->db->mutex);
        p_local._4_4_ = 0x19;
      }
      else {
        iVar2 = i + -1;
        pMVar1 = p->aVar;
        sqlite3VdbeMemRelease(pMVar1 + iVar2);
        pMVar1[iVar2].flags = 1;
        sqlite3Error(p->db,0,(char *)0x0);
        if (((*(ushort *)&p->field_0x9a >> 9 & 1) != 0) &&
           (((iVar2 < 0x20 && ((p->expmask & 1 << ((byte)iVar2 & 0x1f)) != 0)) ||
            (p->expmask == 0xffffffff)))) {
          *(ushort *)&p->field_0x9a = *(ushort *)&p->field_0x9a & 0xffdf | 0x20;
        }
        p_local._4_4_ = 0;
      }
    }
    else {
      sqlite3Error(p->db,0x15,(char *)0x0);
      sqlite3_mutex_leave(p->db->mutex);
      sqlite3_log(0x15,"bind on a busy prepared statement: [%s]",p->zSql);
      p_local._4_4_ = sqlite3MisuseError(0xfabb);
    }
  }
  else {
    p_local._4_4_ = sqlite3MisuseError(0xfab3);
  }
  return p_local._4_4_;
}

Assistant:

static int vdbeUnbind(Vdbe *p, int i){
  Mem *pVar;
  if( vdbeSafetyNotNull(p) ){
    return SQLITE_MISUSE_BKPT;
  }
  sqlite3_mutex_enter(p->db->mutex);
  if( p->magic!=VDBE_MAGIC_RUN || p->pc>=0 ){
    sqlite3Error(p->db, SQLITE_MISUSE, 0);
    sqlite3_mutex_leave(p->db->mutex);
    sqlite3_log(SQLITE_MISUSE, 
        "bind on a busy prepared statement: [%s]", p->zSql);
    return SQLITE_MISUSE_BKPT;
  }
  if( i<1 || i>p->nVar ){
    sqlite3Error(p->db, SQLITE_RANGE, 0);
    sqlite3_mutex_leave(p->db->mutex);
    return SQLITE_RANGE;
  }
  i--;
  pVar = &p->aVar[i];
  sqlite3VdbeMemRelease(pVar);
  pVar->flags = MEM_Null;
  sqlite3Error(p->db, SQLITE_OK, 0);

  /* If the bit corresponding to this variable in Vdbe.expmask is set, then 
  ** binding a new value to this variable invalidates the current query plan.
  **
  ** IMPLEMENTATION-OF: R-48440-37595 If the specific value bound to host
  ** parameter in the WHERE clause might influence the choice of query plan
  ** for a statement, then the statement will be automatically recompiled,
  ** as if there had been a schema change, on the first sqlite3_step() call
  ** following any change to the bindings of that parameter.
  */
  if( p->isPrepareV2 &&
     ((i<32 && p->expmask & ((u32)1 << i)) || p->expmask==0xffffffff)
  ){
    p->expired = 1;
  }
  return SQLITE_OK;
}